

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

void __thiscall
Fl_Text_Display::Fl_Text_Display(Fl_Text_Display *this,int X,int Y,int W,int H,char *l)

{
  uint *puVar1;
  int iVar2;
  Fl_Scrollbar *pFVar3;
  int *piVar4;
  
  Fl_Group::Fl_Group(&this->super_Fl_Group,X,Y,W,H,l);
  (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Text_Display_00279660;
  this->mMaxsize = 0;
  this->damage_range1_start = -1;
  this->damage_range1_end = -1;
  this->damage_range2_start = -1;
  this->damage_range2_end = -1;
  this->shortcut_ = 0;
  this->dragPos = 0;
  this->dragType = 0;
  this->dragging = 0;
  this->display_insert_position_hint = 0;
  (this->super_Fl_Group).super_Fl_Widget.color_ = 7;
  (this->super_Fl_Group).super_Fl_Widget.color2_ = 0xf;
  (this->super_Fl_Group).super_Fl_Widget.box_ = '\x05';
  this->textsize_ = FL_NORMAL_SIZE;
  this->textcolor_ = 0;
  this->textfont_ = 0;
  this->mColumnScale = 0.0;
  puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
  *(byte *)puVar1 = (byte)*puVar1 | 0x40;
  (this->text_area).x = 0;
  (this->text_area).y = 0;
  (this->text_area).w = 0;
  (this->text_area).h = 0;
  pFVar3 = (Fl_Scrollbar *)operator_new(0xb8);
  Fl_Scrollbar::Fl_Scrollbar(pFVar3,0,0,1,1,(char *)0x0);
  this->mVScrollBar = pFVar3;
  (pFVar3->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.callback_ = v_scrollbar_cb;
  (pFVar3->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.user_data_ = this;
  pFVar3 = (Fl_Scrollbar *)operator_new(0xb8);
  Fl_Scrollbar::Fl_Scrollbar(pFVar3,0,0,1,1,(char *)0x0);
  this->mHScrollBar = pFVar3;
  (pFVar3->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.callback_ = h_scrollbar_cb;
  (pFVar3->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.user_data_ = this;
  (pFVar3->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.type_ = '\x01';
  Fl_Group::end(&this->super_Fl_Group);
  iVar2 = Fl::scrollbar_size();
  this->scrollbar_width_ = iVar2;
  this->scrollbar_align_ = 10;
  this->mCursorPos = 0;
  this->mCursorOn = 0;
  this->mCursorOldY = -100;
  this->mCursorToHint = -1;
  this->mBuffer = (Fl_Text_Buffer *)0x0;
  this->mStyleBuffer = (Fl_Text_Buffer *)0x0;
  this->mFirstChar = 0;
  this->mLastChar = 0;
  this->mTopLineNumHint = 1;
  this->mHorizOffsetHint = 0;
  this->mTopLineNum = 1;
  this->mAbsTopLineNum = 1;
  this->mNeedAbsTopLineNum = 0;
  this->mHorizOffset = 0;
  this->mCursor_color = 0;
  this->mStyleTable = (Style_Table_Entry *)0x0;
  this->mNStyles = 0;
  this->mCursorStyle = 0;
  this->mCursorPreferredXPos = -1;
  this->mNVisibleLines = 1;
  this->mNBufferLines = 0;
  piVar4 = (int *)operator_new__(4);
  this->mLineStarts = piVar4;
  *piVar4 = 0;
  this->mUnfinishedStyle = '\0';
  this->mLineNumLeft = 0;
  this->mLineNumWidth = 0;
  this->mContinuousWrap = 0;
  this->mWrapMarginPix = 0;
  this->mUnfinishedHighlightCB = (Unfinished_Style_Cb)0x0;
  this->mHighlightCBArg = (void *)0x0;
  this->mSuppressResync = 0;
  this->mNLinesDeleted = 0;
  this->mModifyingTabDistance = 0;
  return;
}

Assistant:

Fl_Text_Display::Fl_Text_Display(int X, int Y, int W, int H, const char* l)
: Fl_Group(X, Y, W, H, l) {
  int i;

  mMaxsize = 0;
  damage_range1_start = damage_range1_end = -1;
  damage_range2_start = damage_range2_end = -1;
  dragPos = dragging = 0;
  dragType = DRAG_CHAR;
  display_insert_position_hint = 0;
  shortcut_ = 0;

  color(FL_BACKGROUND2_COLOR, FL_SELECTION_COLOR);
  box(FL_DOWN_FRAME);
  textsize(FL_NORMAL_SIZE);
  textcolor(FL_FOREGROUND_COLOR);
  textfont(FL_HELVETICA);
  set_flag(SHORTCUT_LABEL);

  text_area.x = 0;
  text_area.y = 0;
  text_area.w = 0;
  text_area.h = 0;

  mVScrollBar = new Fl_Scrollbar(0,0,1,1);
  mVScrollBar->callback((Fl_Callback*)v_scrollbar_cb, this);
  mHScrollBar = new Fl_Scrollbar(0,0,1,1);
  mHScrollBar->callback((Fl_Callback*)h_scrollbar_cb, this);
  mHScrollBar->type(FL_HORIZONTAL);

  end();

  scrollbar_width(Fl::scrollbar_size());
  scrollbar_align(FL_ALIGN_BOTTOM_RIGHT);

  mCursorOn = 0;
  mCursorPos = 0;
  mCursorOldY = -100;
  mCursorToHint = NO_HINT;
  mCursorStyle = NORMAL_CURSOR;
  mCursorPreferredXPos = -1;
  mBuffer = 0;
  mFirstChar = 0;
  mLastChar = 0;
  mNBufferLines = 0;
  mTopLineNum = mTopLineNumHint = 1;
  mAbsTopLineNum = 1;
  mNeedAbsTopLineNum = 0;
  mHorizOffset = mHorizOffsetHint = 0;

  mCursor_color = FL_FOREGROUND_COLOR;

  mStyleBuffer = 0;
  mStyleTable = 0;
  mNStyles = 0;
  mNVisibleLines = 1;
  mLineStarts = new int[mNVisibleLines];
  mLineStarts[0] = 0;
  for (i=1; i<mNVisibleLines; i++)
    mLineStarts[i] = -1;
  mSuppressResync = 0;
  mNLinesDeleted = 0;
  mModifyingTabDistance = 0;

  mUnfinishedStyle = 0;
  mUnfinishedHighlightCB = 0;
  mHighlightCBArg = 0;

  mLineNumLeft = mLineNumWidth = 0;
  mContinuousWrap = 0;
  mWrapMarginPix = 0;
  mSuppressResync = mNLinesDeleted = mModifyingTabDistance = 0;
#if FLTK_ABI_VERSION >= 10303
  linenumber_font_    = FL_HELVETICA;
  linenumber_size_    = FL_NORMAL_SIZE;
  linenumber_fgcolor_ = FL_INACTIVE_COLOR;
  linenumber_bgcolor_ = 53;	// ~90% gray
  linenumber_align_   = FL_ALIGN_RIGHT;
  linenumber_format_  = strdup("%d");
#endif
}